

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SeparateApprovedAndReceivedDirectoriesNamer.cpp
# Opt level: O2

void __thiscall
ApprovalTests::SeparateApprovedAndReceivedDirectoriesNamer::
SeparateApprovedAndReceivedDirectoriesNamer(SeparateApprovedAndReceivedDirectoriesNamer *this)

{
  string local_30;
  
  separateDirectoryPath_abi_cxx11_();
  TemplatedCustomNamer::TemplatedCustomNamer(&this->super_TemplatedCustomNamer,&local_30);
  ::std::__cxx11::string::~string((string *)&local_30);
  (this->super_TemplatedCustomNamer).super_ApprovalNamer._vptr_ApprovalNamer =
       (_func_int **)&PTR__TemplatedCustomNamer_001bc6c0;
  return;
}

Assistant:

SeparateApprovedAndReceivedDirectoriesNamer::
        SeparateApprovedAndReceivedDirectoriesNamer()
        : TemplatedCustomNamer(separateDirectoryPath())
    {
    }